

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int ipv6_hex(uint8_t *out,char *in,size_t inlen)

{
  char cVar1;
  int iVar2;
  byte local_2b;
  ushort local_2a;
  uint8_t val;
  size_t sStack_28;
  uint16_t num;
  size_t inlen_local;
  char *in_local;
  uint8_t *out_local;
  
  if (inlen < 5) {
    local_2a = 0;
    sStack_28 = inlen;
    inlen_local = (size_t)in;
    in_local = (char *)out;
    while (sStack_28 != 0) {
      cVar1 = *(char *)inlen_local;
      sStack_28 = sStack_28 - 1;
      inlen_local = inlen_local + 1;
      iVar2 = OPENSSL_fromxdigit(&local_2b,(int)cVar1);
      if (iVar2 == 0) {
        return 0;
      }
      local_2a = local_2a << 4 | (ushort)local_2b;
    }
    *in_local = (char)(local_2a >> 8);
    in_local[1] = (char)local_2a;
    out_local._4_4_ = 1;
  }
  else {
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

static int ipv6_hex(uint8_t *out, const char *in, size_t inlen) {
  if (inlen > 4) {
    return 0;
  }
  uint16_t num = 0;
  while (inlen--) {
    uint8_t val;
    if (!OPENSSL_fromxdigit(&val, *in++)) {
      return 0;
    }
    num = (num << 4) | val;
  }
  out[0] = num >> 8;
  out[1] = num & 0xff;
  return 1;
}